

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

kvtree * kvtree_getf(kvtree *hash,char *format,...)

{
  char in_AL;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  kvtree_elem *pkVar4;
  void **ppvVar5;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_RDX;
  uint uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char *format_copy;
  char *rest;
  char key [1024];
  undefined8 local_518;
  void **local_510;
  char *local_4f8;
  char *local_4f0;
  void *local_4e8 [4];
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char local_438 [1032];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if (hash == (kvtree *)0x0) {
    hash = (kvtree_struct *)0x0;
  }
  else {
    local_4f0 = (char *)0x0;
    local_4e8[2] = (void *)in_RDX;
    local_4e8[3] = (void *)in_RCX;
    local_4c8 = in_R8;
    local_4c0 = in_R9;
    local_4f8 = strdup(format);
    if (local_4f8 == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x1ac);
    }
    pcVar3 = strtok_r(local_4f8," ",&local_4f0);
    uVar7 = 0;
    if (pcVar3 != (char *)0x0) {
      do {
        pcVar3 = strtok_r((char *)0x0," ",&local_4f0);
        uVar7 = uVar7 + 1;
      } while (pcVar3 != (char *)0x0);
    }
    kvtree_free(&local_4f8);
    local_4f8 = strdup(format);
    if (local_4f8 == (char *)0x0) {
      kvtree_abort(-1,"Failed to duplicate format string @ %s:%d",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x1c3);
    }
    local_510 = &args[0].overflow_arg_area;
    local_518 = 0x3000000010;
    pcVar3 = strtok_r(local_4f8," ",&local_4f0);
    if (pcVar3 != (char *)0x0 && uVar7 != 0) {
      uVar8 = 1;
      do {
        iVar1 = strcmp(pcVar3,"%s");
        if (iVar1 == 0) {
LAB_00104359:
          uVar6 = local_518 & 0xffffffff;
          if (uVar6 < 0x29) {
            local_518 = CONCAT44(local_518._4_4_,(int)local_518 + 8);
            ppvVar5 = (void **)((long)local_4e8 + uVar6);
          }
          else {
            ppvVar5 = local_510;
            local_510 = local_510 + 1;
          }
          uVar2 = snprintf(local_438,0x400,pcVar3,*ppvVar5);
LAB_001043d2:
          uVar6 = (ulong)uVar2;
        }
        else {
          iVar1 = strcmp(pcVar3,"%d");
          if (iVar1 == 0) {
LAB_00104397:
            uVar6 = local_518 & 0xffffffff;
            if (uVar6 < 0x29) {
              local_518 = CONCAT44(local_518._4_4_,(int)local_518 + 8);
              ppvVar5 = (void **)((long)local_4e8 + uVar6);
            }
            else {
              ppvVar5 = local_510;
              local_510 = local_510 + 1;
            }
            uVar2 = snprintf(local_438,0x400,pcVar3,(ulong)*(uint *)ppvVar5);
            goto LAB_001043d2;
          }
          iVar1 = strcmp(pcVar3,"%lld");
          if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"%lu"), iVar1 == 0)) goto LAB_00104359;
          iVar1 = strcmp(pcVar3,"%#x");
          if (iVar1 == 0) goto LAB_00104397;
          iVar1 = strcmp(pcVar3,"%#lx");
          if ((iVar1 == 0) || (iVar1 = strcmp(pcVar3,"%llu"), iVar1 == 0)) goto LAB_00104359;
          iVar1 = strcmp(pcVar3,"%f");
          if (iVar1 == 0) {
            uVar6 = (ulong)local_518._4_4_;
            if (uVar6 < 0xa1) {
              local_518 = CONCAT44(local_518._4_4_ + 0x10,(int)local_518);
              ppvVar5 = (void **)((long)local_4e8 + uVar6);
            }
            else {
              ppvVar5 = local_510;
              local_510 = local_510 + 1;
            }
            uVar2 = snprintf(local_438,0x400,pcVar3,*ppvVar5);
            goto LAB_001043d2;
          }
          iVar1 = strcmp(pcVar3,"%p");
          if (iVar1 == 0) goto LAB_00104359;
          uVar6 = 0;
          kvtree_abort(-1,"Unsupported hash key format \'%s\' @ %s:%d",pcVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                       ,0x1e6);
        }
        if (0x3ff < (uint)uVar6) {
          kvtree_abort(-1,"Key buffer too small, have %lu need %d bytes @ %s:%d",0x400,uVar6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                       ,0x1ed);
        }
        pkVar4 = kvtree_elem_get(hash,local_438);
        if (pkVar4 == (kvtree_elem *)0x0) {
          hash = (kvtree_struct *)0x0;
        }
        else {
          hash = pkVar4->hash;
        }
        pcVar3 = strtok_r((char *)0x0," ",&local_4f0);
      } while (((uVar8 < uVar7) && (pcVar3 != (char *)0x0)) &&
              (uVar8 = uVar8 + 1, hash != (kvtree_struct *)0x0));
    }
    kvtree_free(&local_4f8);
  }
  return hash;
}

Assistant:

kvtree* kvtree_getf(const kvtree* hash, const char* format, ...)
{
  /* check that we have a hash */
  if (hash == NULL) {
    return NULL;
  }

  const kvtree* h = hash;
  char* rest = NULL;

  /* make a copy of the format specifier, since strtok clobbers it */
  char* format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* we break up tokens by spaces */
  char* search = " ";
  char* token = NULL;

  /* count how many keys we have */
  token = strtok_r(format_copy, search, &rest);
  int count = 0;
  while (token != NULL) {
    token = strtok_r(NULL, search, &rest);
    count++;
  }

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* make a copy of the format specifier, since strtok clobbers it */
  format_copy = strdup(format);
  if (format_copy == NULL) {
    kvtree_abort(-1, "Failed to duplicate format string @ %s:%d",
      __FILE__, __LINE__
    );
  }

  /* for each format specifier, convert the next key argument to a
   * string and look up the hash for that key */
  va_list args;
  va_start(args, format);
  token = strtok_r(format_copy, search, &rest);
  int i = 0;
  while (i < count && token != NULL && h != NULL) {
    /* interpret the format and convert the current key argument to
     * a string */
    char key[KVTREE_MAX_LINE];
    int size = 0;
    if (strcmp(token, "%s") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, char*));
    } else if (strcmp(token, "%d")  == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, int));
    } else if (strcmp(token, "%lld") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, long long));
    } else if (strcmp(token, "%lu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%#x") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned int));
    } else if (strcmp(token, "%#lx") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long));
    } else if (strcmp(token, "%llu") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, unsigned long long));
    } else if (strcmp(token, "%f") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, double));
    } else if (strcmp(token, "%p") == 0) {
      size = snprintf(key, sizeof(key), token, va_arg(args, void*));
    } else {
      kvtree_abort(-1, "Unsupported hash key format '%s' @ %s:%d",
        token, __FILE__, __LINE__
      );
    }

    /* check that we were able to fit the string into our buffer */
    if (size >= sizeof(key)) {
      kvtree_abort(-1, "Key buffer too small, have %lu need %d bytes @ %s:%d",
        sizeof(key), size, __FILE__, __LINE__
      );
    }

    /* get hash for this key */
    h = kvtree_get(h, key);

    /* get the next format string */
    token = strtok_r(NULL, search, &rest);
    i++;
  }
  va_end(args);

  /* free our copy of the format specifier */
  kvtree_free(&format_copy);

  /* return the hash we found */
  return (kvtree*) h;
}